

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_file_expr(gvisitor_t *self,gnode_file_expr_t *node)

{
  _Bool _Var1;
  gravity_function_t *f;
  ircode_t *code;
  gravity_vm *vm;
  uint16_t uVar2;
  uint32_t uVar3;
  char *s;
  size_t sVar4;
  ulong uVar5;
  gravity_value_t v;
  
  f = *(gravity_function_t **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
  if ((f != (gravity_function_t *)0x0) && (f->isa == gravity_class_function)) {
    if (node->identifiers == (cstring_r *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar4 = node->identifiers->n;
    }
    code = (ircode_t *)(f->field_9).field_0.bytecode;
    _Var1 = (node->base).is_assignment;
    for (uVar5 = 0; sVar4 != uVar5; uVar5 = uVar5 + 1) {
      if (uVar5 < node->identifiers->n) {
        s = node->identifiers->p[uVar5];
      }
      else {
        s = (char *)0x0;
      }
      vm = *(gravity_vm **)((long)self->data + 0x38);
      v = gravity_string_to_value((gravity_vm *)0x0,s,0xffffffff);
      uVar2 = gravity_function_cpool_add(vm,f,v);
      if ((sVar4 - 1 == uVar5) && (_Var1 != false)) {
        uVar3 = ircode_register_pop(code);
        if (uVar3 == 0xffffffff) {
          report_error(self,&node->base,"Invalid file expression.");
        }
        ircode_add(code,STOREG,uVar3,(uint)uVar2,0,(node->base).token.lineno);
      }
      else {
        uVar3 = ircode_register_push_temp(code);
        ircode_add(code,LOADG,uVar3,(uint)uVar2,0,(node->base).token.lineno);
      }
    }
    return;
  }
  report_error(self,&node->base,"Invalid code context.");
  return;
}

Assistant:

static void visit_file_expr (gvisitor_t *self, gnode_file_expr_t *node) {
    DEBUG_CODEGEN("visit_file_expr");
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    // check if the node is a left expression of an assignment
    bool is_assignment = node->base.is_assignment;

    size_t count = gnode_array_size(node->identifiers);
    for (size_t i=0; i<count; ++i) {
        const char *identifier = gnode_array_get(node->identifiers, i);
        uint16_t kindex = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, identifier));

        if ((is_assignment) && (IS_LAST_LOOP(i, count))) {
            uint32_t reg = ircode_register_pop(code);
            if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid file expression.");
			ircode_add(code, STOREG, reg, kindex, 0, LINE_NUMBER(node));
        } else {
			ircode_add(code, LOADG, ircode_register_push_temp(code), kindex, 0, LINE_NUMBER(node));
        }
    }

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, (is_assignment) ? -1 : 1);
}